

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>>,std::tuple<mp::expr::Kind,BasicTestExpr<2>,BasicTestExpr<2>>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
                *matcher_tuple,
               tuple<mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>_> *value_tuple)

{
  bool bVar1;
  bool bVar2;
  tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  *in_RSI;
  MatcherBase<BasicTestExpr<2>_> *in_stack_00000008;
  BasicTestExpr<2> in_stack_00000014;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>>,std::tuple<mp::expr::Kind,BasicTestExpr<2>,BasicTestExpr<2>>>
                    (in_RSI,(tuple<mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>_> *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bVar2 = false;
  if (bVar1) {
    std::
    get<1ul,testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>>
              ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
                *)0x2c76c6);
    std::get<1ul,mp::expr::Kind,BasicTestExpr<2>,BasicTestExpr<2>>
              ((tuple<mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>_> *)0x2c76d5);
    bVar2 = MatcherBase<BasicTestExpr<2>_>::Matches(in_stack_00000008,in_stack_00000014);
  }
  return bVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }